

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set(ArenaStringPtr *this,string_view value,Arena *arena)

{
  string *psVar1;
  TaggedStringPtr TVar2;
  string_view value_00;
  string_view s;
  
  s._M_len = value._M_str;
  if (((ulong)(this->tagged_ptr_).ptr_ & 3) != 0) {
    psVar1 = UnsafeMutablePointer_abi_cxx11_(this);
    std::__cxx11::string::assign((char *)psVar1,(ulong)s._M_len);
    return;
  }
  if (arena == (Arena *)0x0) {
    value_00._M_str = s._M_len;
    value_00._M_len = (size_t)s._M_len;
    TVar2 = anon_unknown_7::CreateString((anon_unknown_7 *)value._M_len,value_00);
  }
  else {
    s._M_str = (char *)arena;
    TVar2 = anon_unknown_7::CreateArenaString((anon_unknown_7 *)arena,(Arena *)value._M_len,s);
  }
  (this->tagged_ptr_).ptr_ = TVar2.ptr_;
  return;
}

Assistant:

void ArenaStringPtr::Set(absl::string_view value, Arena* arena) {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) {
    // If we're not on an arena, skip straight to a true string to avoid
    // possible copy cost later.
    tagged_ptr_ = arena != nullptr ? CreateArenaString(*arena, value)
                                   : CreateString(value);
  } else {
    if (internal::DebugHardenForceCopyDefaultString()) {
      if (arena == nullptr) {
        auto* old = tagged_ptr_.GetIfAllocated();
        tagged_ptr_ = CreateString(value);
        delete old;
      } else {
        auto* old = UnsafeMutablePointer();
        tagged_ptr_ = CreateArenaString(*arena, value);
        old->assign("garbagedata");
      }
    } else {
      UnsafeMutablePointer()->assign(value.data(), value.length());
    }
  }
}